

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

string * sensors_analytics::utils::UrlDecode(string *__return_storage_ptr__,string *data)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  allocator local_31;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  uVar1 = data->_M_string_length;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    pcVar2 = (data->_M_dataplus)._M_p;
    if (pcVar2[uVar3] == '%') {
      DecimalFromHex(pcVar2[uVar3 + 1]);
      DecimalFromHex(pcVar2[uVar3 + 2]);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar3 = uVar3 + 2;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string UrlDecode(const string &data)
{
    std::string result = "";
    size_t length = data.length();
    for (size_t i = 0; i < length; i++)
    {
        if (data[i] == '+') result += ' ';
        else if (data[i] == '%') {
            unsigned char high = DecimalFromHex((unsigned char)data[++i]);
            unsigned char low = DecimalFromHex((unsigned char)data[++i]);
            result += high * 16 + low;
        }
        else result += data[i];
    }
    return result;
}